

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall
dlib::add_layer<dlib::con_<64l,7l,7l,2,2,0,0>,dlib::input_rgb_image,void>::
to_tensor<__gnu_cxx::__normal_iterator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>const*,std::vector<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,std::allocator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
          (add_layer<dlib::con_<64l,7l,7l,2,2,0,0>,dlib::input_rgb_image,void> *this,
          __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
          ibegin,__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                 iend,resizable_tensor *data)

{
  uint *puVar1;
  long lVar2;
  ostream *poVar3;
  fatal_error *pfVar4;
  long lVar5;
  ostringstream dlib_o_out;
  string local_1c0;
  long local_1a0 [3];
  uint auStack_188 [88];
  
  input_rgb_image::
  to_tensor<__gnu_cxx::__normal_iterator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>const*,std::vector<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,std::allocator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
            ((input_rgb_image *)this,ibegin,iend,data);
  lVar2 = (data->super_tensor).m_n;
  lVar5 = (long)iend._M_current - (long)ibegin._M_current >> 5;
  if (lVar2 < lVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"\n\nError detected at line ",0x19);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x50b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/core.h"
               ,0x78);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "void dlib::add_layer<dlib::con_<64, 7, 7, 2, 2>, dlib::input_rgb_image>::to_tensor(forward_iterator, forward_iterator, resizable_tensor &) const [LAYER_DETAILS = dlib::con_<64, 7, 7, 2, 2>, INPUT_LAYER = dlib::input_rgb_image, enabled = void, forward_iterator = __gnu_cxx::__normal_iterator<const dlib::matrix<dlib::rgb_pixel> *, std::vector<dlib::matrix<dlib::rgb_pixel>>>]"
               ,0x176);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"data.num_samples() >= std::distance(ibegin,iend)",0x30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".\n",2);
    puVar1 = (uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18));
    *puVar1 = *puVar1 | 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "The input layer can\'t produce fewer output tensors than there are inputs.",0x49);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
    pfVar4 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar4,EBROKEN_ASSERT,&local_1c0);
    __cxa_throw(pfVar4,&fatal_error::typeinfo,error::~error);
  }
  if (lVar2 % lVar5 == 0) {
    *(int *)(this + 0x194) = (int)(lVar2 / lVar5);
    (*(data->super_tensor)._vptr_tensor[0xb])(data);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\n\nError detected at line ",0x19);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x50d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/core.h"
             ,0x78);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "void dlib::add_layer<dlib::con_<64, 7, 7, 2, 2>, dlib::input_rgb_image>::to_tensor(forward_iterator, forward_iterator, resizable_tensor &) const [LAYER_DETAILS = dlib::con_<64, 7, 7, 2, 2>, INPUT_LAYER = dlib::input_rgb_image, enabled = void, forward_iterator = __gnu_cxx::__normal_iterator<const dlib::matrix<dlib::rgb_pixel> *, std::vector<dlib::matrix<dlib::rgb_pixel>>>]"
             ,0x176);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"data.num_samples()%std::distance(ibegin,iend) == 0",0x32);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".\n",2);
  puVar1 = (uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "The number of tensors produced by the input layer must be an integer multiple of the number of input objects."
             ,0x6d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
  pfVar4 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(pfVar4,EBROKEN_ASSERT,&local_1c0);
  __cxa_throw(pfVar4,&fatal_error::typeinfo,error::~error);
}

Assistant:

void to_tensor (
            forward_iterator ibegin,
            forward_iterator iend,
            resizable_tensor& data
        ) const
        {
            input_layer_.to_tensor(ibegin, iend, data);
            // make sure the input layer's to_tensor() function is implemented properly.
            DLIB_CASSERT(data.num_samples() >= std::distance(ibegin,iend), 
            "The input layer can't produce fewer output tensors than there are inputs.");
            DLIB_CASSERT(data.num_samples()%std::distance(ibegin,iend) == 0,
            "The number of tensors produced by the input layer must be an integer multiple of the number of input objects.");

            _sample_expansion_factor = data.num_samples()/std::distance(ibegin,iend);
            data.async_copy_to_device();
        }